

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ftint_s_df_mipsel(CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  int32_t iVar6;
  float32 fVar7;
  float64 fVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar13;
  long lVar14;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_40 [2];
  uint uVar12;
  
  lVar4 = (ulong)ws * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      iVar6 = float32_to_int32_mipsel
                        (*(float32 *)((long)(env->active_fpu).fpr + lVar14 * 4 + lVar4 + -0x228),
                         pfVar2);
      *(int32_t *)((long)local_40 + lVar14 * 4) = iVar6;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mipsel((uint)bVar3);
      uVar9 = (env->active_tc).msacsr;
      uVar13 = (uVar9 & 0x1000000) >> 0x18 & (uint)(bVar3 >> 6) | uVar5;
      uVar5 = (uVar5 & 0xfffffffc) + 1;
      if ((uVar9 & 0x1000000) == 0) {
        uVar5 = uVar13;
      }
      if (-1 < (char)bVar3) {
        uVar5 = uVar13;
      }
      uVar12 = (uint)((uVar9 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar11 = uVar12 | uVar5;
      uVar13 = uVar5 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar5 & 1) != 0) || (uVar9 & 0x100) != 0) {
        uVar13 = uVar11;
      }
      if ((uVar5 & 2) == 0) {
        uVar13 = uVar11;
      }
      if ((uVar13 & (uVar9 >> 7 & 0x1f | 0x20)) == 0) {
        uVar5 = uVar13 << 0xc;
LAB_0082668f:
        (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar9;
      }
      else if ((uVar9 >> 0x12 & 1) == 0) {
        uVar5 = uVar13 << 0xc | uVar9;
        uVar9 = uVar9 & 0xfff80fff;
        goto LAB_0082668f;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) == 0) {
        uVar13 = 0;
        if (0x7f800000 <
            (*(uint *)((long)(env->active_fpu).fpr + lVar14 * 4 + lVar4 + -0x228) & 0x7fffffff))
        goto LAB_008266d5;
      }
      else {
        fVar7 = float32_default_nan_mipsel(pfVar2);
        uVar13 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar13;
LAB_008266d5:
        *(uint *)((long)local_40 + lVar14 * 4) = uVar13;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c95,
                    "void helper_msa_ftint_s_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = float64_to_int64_mipsel
                        (*(float64 *)((long)(env->active_fpu).fpr + lVar14 * 8 + lVar4 + -0x228),
                         pfVar2);
      local_40[lVar14] = fVar8;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mipsel((uint)bVar3);
      uVar9 = (env->active_tc).msacsr;
      uVar13 = (uVar9 & 0x1000000) >> 0x18 & (uint)(bVar3 >> 6) | uVar5;
      uVar5 = (uVar5 & 0xfffffffc) + 1;
      if ((uVar9 & 0x1000000) == 0) {
        uVar5 = uVar13;
      }
      if (-1 < (char)bVar3) {
        uVar5 = uVar13;
      }
      uVar12 = (uint)((uVar9 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar11 = uVar12 | uVar5;
      uVar13 = uVar5 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar5 & 1) != 0) || (uVar9 & 0x100) != 0) {
        uVar13 = uVar11;
      }
      if ((uVar5 & 2) == 0) {
        uVar13 = uVar11;
      }
      if ((uVar13 & (uVar9 >> 7 & 0x1f | 0x20)) == 0) {
        uVar5 = uVar13 << 0xc;
LAB_00826556:
        (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar9;
      }
      else if ((uVar9 >> 0x12 & 1) == 0) {
        uVar5 = uVar13 << 0xc | uVar9;
        uVar9 = uVar9 & 0xfff80fff;
        goto LAB_00826556;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) == 0) {
        if (0x7ff0000000000000 <
            (*(ulong *)((long)(env->active_fpu).fpr + lVar14 * 8 + lVar4 + -0x228) &
            0x7fffffffffffffff)) {
          uVar10 = 0;
          goto LAB_008265a8;
        }
      }
      else {
        fVar8 = float64_default_nan_mipsel(pfVar2);
        uVar10 = (long)(int)uVar13 | fVar8 & 0xffffffffffffffc0 ^ 0x8000000000000;
LAB_008265a8:
        local_40[lVar14] = uVar10;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
  }
  uVar9 = (env->active_tc).msacsr;
  uVar5 = uVar9 >> 7 & 0x1f | 0x20;
  if ((uVar5 & uVar9 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar5);
  }
  (env->active_tc).msacsr = (uVar9 >> 0xc & 0x1f) << 2 | uVar9;
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_ftint_s_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                           uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP0(pwx->w[i], to_int32, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP0(pwx->d[i], to_int64, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}